

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void recordFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  bool bVar1;
  u32 uVar2;
  uint uVar3;
  ulong uVar4;
  char *z;
  sqlite3_value *psVar5;
  char *pcVar6;
  int iVar7;
  ulong v;
  u32 nVal;
  u32 local_44;
  sqlite3_context *local_40;
  sqlite3 *local_38;
  
  uVar2 = sqlite3VdbeSerialType(*argv,1,&local_44);
  v = (ulong)uVar2;
  iVar7 = 2;
  uVar4 = v;
  if (0x7f < uVar2) {
    do {
      iVar7 = iVar7 + 1;
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar4 >> 7;
    } while (bVar1);
  }
  local_38 = context->pOut->db;
  z = (char *)sqlite3DbMallocRawNN(local_38,(long)(int)(local_44 + iVar7));
  if (z == (char *)0x0) {
    sqlite3_result_error_nomem(context);
    return;
  }
  *z = (char)iVar7;
  local_40 = context;
  if (uVar2 < 0x80) {
    z[1] = (char)uVar2;
    psVar5 = *argv;
    if (uVar2 - 1 < 7) {
      uVar3 = (uint)""[v];
      pcVar6 = z + (ulong)(""[v] - 1) + (long)iVar7;
      uVar4 = (psVar5->u).i;
      do {
        *pcVar6 = (char)uVar4;
        pcVar6 = pcVar6 + -1;
        uVar3 = uVar3 - 1;
        uVar4 = uVar4 >> 8;
      } while (uVar3 != 0);
      goto LAB_001ae862;
    }
    if (uVar2 < 0xc) goto LAB_001ae862;
  }
  else {
    sqlite3PutVarint((uchar *)(z + 1),v);
    psVar5 = *argv;
  }
  if ((ulong)(uint)psVar5->n != 0) {
    memcpy(z + iVar7,psVar5->z,(ulong)(uint)psVar5->n);
  }
LAB_001ae862:
  setResultStrOrError(local_40,z,local_44 + iVar7,'\0',(_func_void_void_ptr *)0xffffffffffffffff);
  sqlite3DbFreeNN(local_38,z);
  return;
}

Assistant:

static void recordFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const int file_format = 1;
  u32 iSerial;                    /* Serial type */
  int nSerial;                    /* Bytes of space for iSerial as varint */
  u32 nVal;                       /* Bytes of space required for argv[0] */
  int nRet;
  sqlite3 *db;
  u8 *aRet;

  UNUSED_PARAMETER( argc );
  iSerial = sqlite3VdbeSerialType(argv[0], file_format, &nVal);
  nSerial = sqlite3VarintLen(iSerial);
  db = sqlite3_context_db_handle(context);

  nRet = 1 + nSerial + nVal;
  aRet = sqlite3DbMallocRawNN(db, nRet);
  if( aRet==0 ){
    sqlite3_result_error_nomem(context);
  }else{
    aRet[0] = nSerial+1;
    putVarint32(&aRet[1], iSerial);
    sqlite3VdbeSerialPut(&aRet[1+nSerial], argv[0], iSerial);
    sqlite3_result_blob(context, aRet, nRet, SQLITE_TRANSIENT);
    sqlite3DbFreeNN(db, aRet);
  }
}